

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpermissions.cpp
# Opt level: O0

PermissionStatus QPermissions::Private::checkPermission(QPermission *permission)

{
  bool bVar1;
  long in_FS_OFFSET;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategory *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  QDebug *in_stack_ffffffffffffff78;
  QDebug *in_stack_ffffffffffffff98;
  QDebug *in_stack_ffffffffffffffb8;
  QPermission *in_stack_ffffffffffffffc8;
  QDebug *in_stack_ffffffffffffffd0;
  QDebug local_28 [2];
  char *local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  QtPrivateLogging::lcPermissions();
  anon_unknown.dwarf_161020b::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68
            );
  while( true ) {
    bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                      ((QLoggingCategoryMacroHolder *)&local_18);
    if (!bVar1) break;
    anon_unknown.dwarf_161020b::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x915107);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)&stack0xffffffffffffffb0,(char *)in_stack_ffffffffffffff78,
               in_stack_ffffffffffffff74,(char *)in_stack_ffffffffffffff68,(char *)0x915120);
    QMessageLogger::debug((QMessageLogger *)&stack0xffffffffffffffd0);
    QDebug::operator<<(in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffffc8);
    in_stack_ffffffffffffff78 =
         QDebug::operator<<(in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffffc8);
    QDebug::QDebug(local_28,in_stack_ffffffffffffff78);
    ::operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    QDebug::~QDebug(in_stack_ffffffffffffffb8);
    QDebug::~QDebug(in_stack_ffffffffffffffb8);
    QDebug::~QDebug(in_stack_ffffffffffffffb8);
    local_10 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return Granted;
  }
  __stack_chk_fail();
}

Assistant:

Qt::PermissionStatus checkPermission(const QPermission &permission)
    {
        qCDebug(lcPermissions) << "No permission backend on this platform."
            << "Optimistically returning Granted for" << permission;
        return Qt::PermissionStatus::Granted;
    }